

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack8_int8.h
# Opt level: O0

void ncnn::padding_replicate_pack8_int8_sse(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  int iVar1;
  int local_84;
  int local_80;
  int x_8;
  int x_7;
  int x_6;
  int64_t *ptr0_1;
  int y_2;
  int x_5;
  int x_4;
  int x_3;
  int y_1;
  int x_2;
  int x_1;
  int x;
  int64_t *ptr0;
  int64_t *piStack_40;
  int y;
  int64_t *outptr;
  int64_t *ptr;
  int right_local;
  int left_local;
  int bottom_local;
  int top_local;
  Mat *dst_local;
  Mat *src_local;
  
  outptr = (int64_t *)src->data;
  piStack_40 = (int64_t *)dst->data;
  for (ptr0._4_4_ = 0; ptr0._4_4_ < top; ptr0._4_4_ = ptr0._4_4_ + 1) {
    for (x_2 = 0; x_2 < left; x_2 = x_2 + 1) {
      *piStack_40 = *outptr;
      piStack_40 = piStack_40 + 1;
    }
    _x_1 = outptr;
    for (y_1 = 0; y_1 < src->w; y_1 = y_1 + 1) {
      *piStack_40 = *_x_1;
      _x_1 = _x_1 + 1;
      piStack_40 = piStack_40 + 1;
    }
    for (x_3 = 0; x_3 < right; x_3 = x_3 + 1) {
      *piStack_40 = _x_1[-1];
      piStack_40 = piStack_40 + 1;
    }
  }
  for (x_4 = 0; x_4 < src->h; x_4 = x_4 + 1) {
    for (x_5 = 0; x_5 < left; x_5 = x_5 + 1) {
      *piStack_40 = *outptr;
      piStack_40 = piStack_40 + 1;
    }
    for (y_2 = 0; y_2 < src->w; y_2 = y_2 + 1) {
      *piStack_40 = *outptr;
      piStack_40 = piStack_40 + 1;
      outptr = outptr + 1;
    }
    for (ptr0_1._4_4_ = 0; ptr0_1._4_4_ < right; ptr0_1._4_4_ = ptr0_1._4_4_ + 1) {
      *piStack_40 = outptr[-1];
      piStack_40 = piStack_40 + 1;
    }
  }
  iVar1 = src->w;
  for (ptr0_1._0_4_ = 0; (int)ptr0_1 < bottom; ptr0_1._0_4_ = (int)ptr0_1 + 1) {
    for (x_8 = 0; x_8 < left; x_8 = x_8 + 1) {
      *piStack_40 = outptr[-(long)iVar1];
      piStack_40 = piStack_40 + 1;
    }
    _x_7 = outptr + -(long)iVar1;
    for (local_80 = 0; local_80 < src->w; local_80 = local_80 + 1) {
      *piStack_40 = *_x_7;
      _x_7 = _x_7 + 1;
      piStack_40 = piStack_40 + 1;
    }
    for (local_84 = 0; local_84 < right; local_84 = local_84 + 1) {
      *piStack_40 = _x_7[-1];
      piStack_40 = piStack_40 + 1;
    }
  }
  return;
}

Assistant:

static void padding_replicate_pack8_int8_sse(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    const int64_t* ptr = src;
    int64_t* outptr = dst;

    // fill top
    for (int y = 0; y < top; y++)
    {
        const int64_t* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            *outptr++ = *ptr0;
        }
        for (int x = 0; x < src.w; x++)
        {
            *outptr++ = *ptr0++;
        }
        for (int x = 0; x < right; x++)
        {
            *outptr++ = ptr0[-1];
        }
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        for (int x = 0; x < left; x++)
        {
            *outptr++ = *ptr;
        }
        for (int x = 0; x < src.w; x++)
        {
            *outptr++ = *ptr++;
        }
        for (int x = 0; x < right; x++)
        {
            *outptr++ = ptr[-1];
        }
    }
    // fill bottom
    ptr -= src.w;
    for (int y = 0; y < bottom; y++)
    {
        const int64_t* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            *outptr++ = *ptr0;
        }
        for (int x = 0; x < src.w; x++)
        {
            *outptr++ = *ptr0++;
        }
        for (int x = 0; x < right; x++)
        {
            *outptr++ = ptr0[-1];
        }
    }
}